

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::~QWidgetWindow(QWidgetWindow *this)

{
  bool bVar1;
  QTLWExtra *pQVar2;
  QWidgetPrivate *in_RDI;
  QTLWExtra *topData;
  pointer in_stack_ffffffffffffffd8;
  QBackingStore *this_00;
  
  *(undefined ***)in_RDI = &PTR_metaObject_00d08e58;
  *(undefined ***)&in_RDI->field_0x10 = &PTR__QWidgetWindow_00d08f90;
  QWindow::destroy();
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x3b3499);
  if (bVar1) {
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b34b8);
    QWidgetPrivate::get((QWidget *)0x3b34c0);
    pQVar2 = QWidgetPrivate::topData(in_RDI);
    std::unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::reset
              ((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_> *)
               in_RDI,in_stack_ffffffffffffffd8);
    this_00 = pQVar2->backingStore;
    if (this_00 != (QBackingStore *)0x0) {
      QBackingStore::~QBackingStore(this_00);
      operator_delete(this_00,8);
    }
    pQVar2->backingStore = (QBackingStore *)0x0;
    std::
    vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
    ::clear((vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
             *)0x3b3527);
    pQVar2->window = (QWidgetWindow *)0x0;
  }
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x3b354a);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x3b3558);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x3b3566);
  QWindow::~QWindow((QWindow *)in_RDI);
  return;
}

Assistant:

QWidgetWindow::~QWidgetWindow()
{
    // destroy while we are still alive
    destroy();

    if (!m_widget)
        return;

    QTLWExtra *topData = QWidgetPrivate::get(m_widget)->topData();
    Q_ASSERT(topData);

    // The QPlaformBackingStore may hold a reference to the window,
    // so the backingstore needs to be deleted first.
    topData->repaintManager.reset(nullptr);
    delete topData->backingStore;
    topData->backingStore = nullptr;
    topData->widgetTextures.clear();

    // Too late to do anything beyond this point
    topData->window = nullptr;
}